

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

Path * Pathie::Path::exe(void)

{
  ssize_t sVar1;
  ErrnoError *this;
  int *piVar2;
  Path *in_RDI;
  char buf [4096];
  string local_1058;
  string local_1038;
  char local_1018 [4104];
  
  sVar1 = ::readlink("/proc/self/exe",local_1018,0x1000);
  if (-1 < sVar1) {
    local_1058._M_dataplus._M_p = (pointer)&local_1058.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1058,local_1018,local_1018 + sVar1);
    filename_to_utf8(&local_1038,&local_1058);
    Path(in_RDI,&local_1038);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1038._M_dataplus._M_p != &local_1038.field_2) {
      operator_delete(local_1038._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1058._M_dataplus._M_p != &local_1058.field_2) {
      operator_delete(local_1058._M_dataplus._M_p);
    }
    return in_RDI;
  }
  this = (ErrnoError *)__cxa_allocate_exception(0x30);
  piVar2 = __errno_location();
  ErrnoError::ErrnoError(this,*piVar2);
  __cxa_throw(this,&ErrnoError::typeinfo,GlobError::~GlobError);
}

Assistant:

Path Path::exe()
{
#if defined(__linux__)
  char buf[PATH_MAX];
  ssize_t size = ::readlink("/proc/self/exe", buf, PATH_MAX);

  if (size < 0)
    throw(Pathie::ErrnoError(errno));

  return Path(filename_to_utf8(std::string(buf, size)));
#elif defined(__APPLE__)
  char buf[PATH_MAX];
  uint32_t size = sizeof(buf);

  if (_NSGetExecutablePath(buf, &size) == 0)
    // Might contain symlinks or extra slashes. Shouldn't be an issue though
    // https://stackoverflow.com/questions/799679/programmatically-retrieving-the-absolute-path-of-an-os-x-command-line-app/1024933#1024933
    return Path(filename_to_utf8(std::string(buf, size)));
  else
    throw(Pathie::ErrnoError(errno));
#elif defined(BSD)
  // BSD does not have /proc mounted by default. However, using raw syscalls,
  // we can figure out what would have been in /proc/curproc/file. See
  // sysctl(3) for the management info base identifiers that are used here.
  int mib[4];
  char buf[PATH_MAX];
  size_t bufsize = PATH_MAX;
  mib[0] = CTL_KERN;
  mib[1] = KERN_PROC;
  mib[2] = KERN_PROC_PATHNAME;
  mib[3] = -1; // According to sysctl(3), -1 means the current process.

  if (sysctl(mib, 4, buf, &bufsize, NULL, 0) != 0) // Note this changes `bufsize' to the number of chars copied
    throw(Pathie::ErrnoError(errno));

  return Path(filename_to_utf8(std::string(buf, bufsize - 1))); // Exclude terminating NUL
#elif defined(_WIN32)
  wchar_t buf[MAX_PATH];
  if (GetModuleFileNameW(NULL, buf, MAX_PATH) == 0) {
    DWORD err = GetLastError();
    throw(Pathie::WindowsError(err));
  }

  std::string str = utf16_to_utf8(buf);
  return Path(str);
#else
#error Unsupported platform.
#endif
}